

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AlsavoCtrl.cpp
# Opt level: O2

void __thiscall AlsavoSession::Disconnect(AlsavoSession *this)

{
  Verbosity VVar1;
  double __x;
  initializer_list<unsigned_char> __l;
  allocator_type local_2d;
  uchar local_2c [4];
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_28;
  
  VVar1 = loguru::current_verbosity_cutoff();
  if (-1 < VVar1) {
    loguru::log(__x);
  }
  if (this->m_ConnectionStatus == Connected) {
    local_2c[0] = '\a';
    local_2c[1] = '\0';
    local_2c[2] = '\0';
    local_2c[3] = '\0';
    __l._M_len = 4;
    __l._M_array = local_2c;
    CLI::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_28,__l,&local_2d);
    SendPacketNow(this,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_28,0,false,
                  0xf3);
    CLI::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_28);
  }
  UpdateConnectionStatus(this,Disconnected);
  this->m_NextSeq = 0;
  CLI::std::deque<AlsavoSession::PacketQueueItem,_std::allocator<AlsavoSession::PacketQueueItem>_>::
  clear(&this->m_OutQueue);
  if (this->m_Sock != 0) {
    close(this->m_Sock);
    this->m_Sock = 0;
  }
  return;
}

Assistant:

void Disconnect()
	{
		LOG_F(INFO, "Disconnecting.");
		if (m_ConnectionStatus == ConnectionStatus::Connected)
		{
			SendPacketNow({ 0x07, 0, 0, 0 }, 0, false, 0xf3);
		}
		UpdateConnectionStatus(ConnectionStatus::Disconnected);
		m_NextSeq = 0;
		m_OutQueue.clear();
		if (m_Sock != 0)
		{
#ifdef _MSC_VER
			closesocket(m_Sock);
#else
			close(m_Sock);
#endif
			m_Sock = 0;
		}
	}